

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O3

int res2_inverse(vorbis_block *vb,vorbis_look_residue *vl,float **in,int *nonzero,int ch)

{
  int n;
  long *plVar1;
  codebook *book;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long local_78;
  
  plVar1 = *vl;
  iVar2 = vb->pcmend * ch >> 1;
  if (plVar1[1] < (long)iVar2) {
    iVar2 = (int)plVar1[1];
  }
  iVar2 = iVar2 - (int)*plVar1;
  if (0 < iVar2) {
    n = (int)plVar1[2];
    iVar2 = iVar2 / n;
    iVar9 = (int)**(undefined8 **)((long)vl + 0x18);
    pvVar4 = _vorbis_block_alloc(vb,(long)((iVar2 + iVar9 + -1) / iVar9) << 3);
    if (ch < 1) {
      lVar7 = 0;
LAB_001e286b:
      if ((lVar7 != ch) && (iVar3 = *(int *)((long)vl + 0xc), 0 < iVar3)) {
        lVar7 = (long)iVar2;
        local_78 = 0;
        do {
          if (0 < iVar2) {
            lVar8 = 0;
            lVar10 = 0;
            do {
              if (local_78 == 0) {
                lVar5 = vorbis_book_decode(*(codebook **)((long)vl + 0x18),&vb->opb);
                iVar3 = (int)lVar5;
                if (iVar3 == -1) {
                  return 0;
                }
                if ((int)plVar1[3] <= iVar3) {
                  return 0;
                }
                lVar5 = *(long *)(*(long *)((long)vl + 0x30) + (long)iVar3 * 8);
                *(long *)((long)pvVar4 + lVar10 * 8) = lVar5;
                if (lVar5 == 0) {
                  return 0;
                }
              }
              if ((0 < (long)iVar9) && (lVar8 < lVar7)) {
                lVar5 = n * lVar8;
                lVar11 = 1;
                do {
                  lVar6 = (long)*(int *)(*(long *)((long)pvVar4 + lVar10 * 8) + -4 + lVar11 * 4);
                  if ((((*(uint *)((long)plVar1 + lVar6 * 4 + 0x20) & 1 << ((byte)local_78 & 0x1f))
                        != 0) &&
                      (book = *(codebook **)
                               (*(long *)(*(long *)((long)vl + 0x20) + lVar6 * 8) + local_78 * 8),
                      book != (codebook *)0x0)) &&
                     (lVar6 = vorbis_book_decodevv_add(book,in,*plVar1 + lVar5,ch,&vb->opb,n),
                     lVar6 == -1)) {
                    return 0;
                  }
                  lVar8 = lVar8 + 1;
                  if (iVar9 <= lVar11) break;
                  lVar5 = lVar5 + n;
                  lVar11 = lVar11 + 1;
                } while (lVar8 < lVar7);
              }
              lVar10 = lVar10 + 1;
            } while (lVar8 < lVar7);
            iVar3 = *(int *)((long)vl + 0xc);
          }
          local_78 = local_78 + 1;
        } while (local_78 < iVar3);
      }
    }
    else {
      lVar7 = 0;
      do {
        if (nonzero[lVar7] != 0) goto LAB_001e286b;
        lVar7 = lVar7 + 1;
      } while (ch != lVar7);
    }
  }
  return 0;
}

Assistant:

int res2_inverse(vorbis_block *vb,vorbis_look_residue *vl,
                 float **in,int *nonzero,int ch){
  long i,k,l,s;
  vorbis_look_residue0 *look=(vorbis_look_residue0 *)vl;
  vorbis_info_residue0 *info=look->info;

  /* move all this setup out later */
  int samples_per_partition=info->grouping;
  int partitions_per_word=look->phrasebook->dim;
  int max=(vb->pcmend*ch)>>1;
  int end=(info->end<max?info->end:max);
  int n=end-info->begin;

  if(n>0){
    int partvals=n/samples_per_partition;
    int partwords=(partvals+partitions_per_word-1)/partitions_per_word;
    int **partword=_vorbis_block_alloc(vb,partwords*sizeof(*partword));

    for(i=0;i<ch;i++)if(nonzero[i])break;
    if(i==ch)return(0); /* no nonzero vectors */

    for(s=0;s<look->stages;s++){
      for(i=0,l=0;i<partvals;l++){

        if(s==0){
          /* fetch the partition word */
          int temp=vorbis_book_decode(look->phrasebook,&vb->opb);
          if(temp==-1 || temp>=info->partvals)goto eopbreak;
          partword[l]=look->decodemap[temp];
          if(partword[l]==NULL)goto errout;
        }

        /* now we decode residual values for the partitions */
        for(k=0;k<partitions_per_word && i<partvals;k++,i++)
          if(info->secondstages[partword[l][k]]&(1<<s)){
            codebook *stagebook=look->partbooks[partword[l][k]][s];

            if(stagebook){
              if(vorbis_book_decodevv_add(stagebook,in,
                                          i*samples_per_partition+info->begin,ch,
                                          &vb->opb,samples_per_partition)==-1)
                goto eopbreak;
            }
          }
      }
    }
  }
 errout:
 eopbreak:
  return(0);
}